

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O1

char * ini_property_name(ini_t *ini,int section,int property)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  ini_internal_property_t *piVar4;
  int iVar5;
  
  if ((-1 < section && ini != (ini_t *)0x0) && (section < ini->section_count)) {
    iVar1 = -1;
    if (0 < (long)ini->property_count) {
      piVar4 = ini->properties;
      lVar3 = 0;
      iVar5 = 0;
      do {
        if (piVar4->section == section) {
          if (iVar5 == property) {
            iVar1 = (int)lVar3;
            break;
          }
          iVar5 = iVar5 + 1;
        }
        lVar3 = lVar3 + 1;
        piVar4 = piVar4 + 1;
      } while (ini->property_count != lVar3);
    }
    if (iVar1 != -1) {
      pcVar2 = ini->properties[iVar1].name_large;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = ini->properties[iVar1].name;
      }
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char const* ini_property_name( ini_t const* ini, int section, int property )
    {
    int p;

    if( ini && section >= 0 && section < ini->section_count )
        {
        p = ini_internal_property_index( ini, section, property );
        if( p != INI_NOT_FOUND )
            return ini->properties[ p ].name_large ? ini->properties[ p ].name_large : ini->properties[ p ].name;
        }

    return NULL;
    }